

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBlock * AnalyzeBlock(ExpressionContext *ctx,SynBlock *syntax,bool createScope)

{
  TypeBase *pTVar1;
  ScopeData *pSVar2;
  ExprBase *pEVar3;
  int iVar4;
  ExprBase *pEVar5;
  undefined4 extraout_var;
  SynBase *pSVar7;
  ExprBase *pEVar8;
  undefined4 extraout_var_00;
  undefined7 in_register_00000011;
  FunctionData *onwerFunction;
  IntrusiveList<ExprBase> expressions;
  IntrusiveList<ExprBase> local_48;
  ExprBlock *pEVar6;
  
  if ((int)CONCAT71(in_register_00000011,createScope) == 0) {
    local_48.head = (ExprBase *)0x0;
    local_48.tail = (ExprBase *)0x0;
    for (pSVar7 = (syntax->expressions).head; pSVar7 != (SynBase *)0x0; pSVar7 = pSVar7->next) {
      pEVar5 = AnalyzeStatement(ctx,pSVar7);
      IntrusiveList<ExprBase>::push_back(&local_48,pEVar5);
    }
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar6 = (ExprBlock *)CONCAT44(extraout_var_00,iVar4);
    pTVar1 = ctx->typeVoid;
    (pEVar6->super_ExprBase).typeID = 0x36;
    (pEVar6->super_ExprBase).source = &syntax->super_SynBase;
    (pEVar6->super_ExprBase).type = pTVar1;
    (pEVar6->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar6->super_ExprBase).listed = false;
    (pEVar6->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_0022a0b0;
    (pEVar6->expressions).head = local_48.head;
    (pEVar6->expressions).tail = local_48.tail;
    pEVar6->closures = (ExprBase *)0x0;
  }
  else {
    ExpressionContext::PushScope(ctx,SCOPE_EXPLICIT);
    local_48.head = (ExprBase *)0x0;
    local_48.tail = (ExprBase *)0x0;
    for (pSVar7 = (syntax->expressions).head; pSVar7 != (SynBase *)0x0; pSVar7 = pSVar7->next) {
      pEVar5 = AnalyzeStatement(ctx,pSVar7);
      IntrusiveList<ExprBase>::push_back(&local_48,pEVar5);
    }
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar3 = local_48.tail;
    pEVar5 = local_48.head;
    pEVar6 = (ExprBlock *)CONCAT44(extraout_var,iVar4);
    pTVar1 = ctx->typeVoid;
    pSVar7 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
    for (pSVar2 = ctx->scope; (pSVar2 != (ScopeData *)0x0 && (pSVar2->ownerType == (TypeBase *)0x0))
        ; pSVar2 = pSVar2->scope) {
      onwerFunction = pSVar2->ownerFunction;
      if (onwerFunction != (FunctionData *)0x0) goto LAB_00170f94;
    }
    onwerFunction = (FunctionData *)0x0;
LAB_00170f94:
    pEVar8 = CreateBlockUpvalueClose(ctx,pSVar7,onwerFunction,ctx->scope);
    (pEVar6->super_ExprBase).typeID = 0x36;
    (pEVar6->super_ExprBase).source = &syntax->super_SynBase;
    (pEVar6->super_ExprBase).type = pTVar1;
    (pEVar6->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar6->super_ExprBase).listed = false;
    (pEVar6->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_0022a0b0;
    (pEVar6->expressions).head = pEVar5;
    (pEVar6->expressions).tail = pEVar3;
    pEVar6->closures = pEVar8;
    ExpressionContext::PopScope(ctx,SCOPE_EXPLICIT,true);
  }
  return pEVar6;
}

Assistant:

ExprBlock* AnalyzeBlock(ExpressionContext &ctx, SynBlock *syntax, bool createScope)
{
	if(createScope)
	{
		ctx.PushScope(SCOPE_EXPLICIT);

		IntrusiveList<ExprBase> expressions;

		for(SynBase *expression = syntax->expressions.head; expression; expression = expression->next)
			expressions.push_back(AnalyzeStatement(ctx, expression));

		ExprBlock *block = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, expressions, CreateBlockUpvalueClose(ctx, ctx.MakeInternal(syntax), ctx.GetCurrentFunction(ctx.scope), ctx.scope));

		ctx.PopScope(SCOPE_EXPLICIT);

		return block;
	}

	IntrusiveList<ExprBase> expressions;

	for(SynBase *expression = syntax->expressions.head; expression; expression = expression->next)
		expressions.push_back(AnalyzeStatement(ctx, expression));

	return new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, expressions, NULL);
}